

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetDiagonalCovariance
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *diagonal_covariance)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  double *pdVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  double *mu;
  vector<double,_std::allocator<double>_> mean;
  int i;
  double *variance;
  double z;
  double *in_stack_ffffffffffffff18;
  int column;
  Row *in_stack_ffffffffffffff20;
  Row *pRVar6;
  SymmetricMatrix *in_stack_ffffffffffffff28;
  SymmetricMatrix *this_00;
  undefined7 in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar7;
  StatisticsAccumulation *in_stack_ffffffffffffff78;
  SymmetricMatrix local_78;
  int local_34;
  reference local_30;
  Row *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  long local_18;
  byte local_1;
  
  if (((((*(byte *)(in_RDI + 0x12) & 1) == 0) || (*(int *)(in_RDI + 0xc) < 2)) ||
      (*(int *)(in_RSI + 8) < 1)) || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar3 != (long)(*(int *)(in_RDI + 8) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    local_28 = (Row *)(1.0 / (double)*(int *)(local_18 + 8));
    local_30 = std::vector<double,_std::allocator<double>_>::operator[](local_20,0);
    if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
      this_00 = &local_78;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x10a3c9);
      uVar2 = GetMean(in_stack_ffffffffffffff78,
                      (Buffer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
      if ((bool)uVar2) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_78,0);
        for (iVar7 = 0; column = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
            iVar7 <= *(int *)(in_RDI + 8); iVar7 = iVar7 + 1) {
          pRVar6 = local_28;
          SymmetricMatrix::operator[](this_00,(int)((ulong)local_28 >> 0x20));
          in_stack_ffffffffffffff18 = SymmetricMatrix::Row::operator[](pRVar6,column);
          local_30[iVar7] =
               (double)pRVar6 * *in_stack_ffffffffffffff18 + -(pvVar5[iVar7] * pvVar5[iVar7]);
          SymmetricMatrix::Row::~Row((Row *)&stack0xffffffffffffff58);
        }
        bVar1 = false;
      }
      else {
        local_1 = 0;
        bVar1 = true;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff30));
      if (bVar1) goto LAB_0010a555;
    }
    else {
      for (local_34 = 0; local_34 <= *(int *)(in_RDI + 8); local_34 = local_34 + 1) {
        pRVar6 = local_28;
        SymmetricMatrix::operator[]
                  (in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        pdVar4 = SymmetricMatrix::Row::operator[]
                           (in_stack_ffffffffffffff20,
                            (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        local_30[local_34] = (double)pRVar6 * *pdVar4;
        SymmetricMatrix::Row::~Row((Row *)&local_78.index_);
      }
    }
    local_1 = 1;
  }
LAB_0010a555:
  return (bool)(local_1 & 1);
}

Assistant:

bool StatisticsAccumulation::GetDiagonalCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* diagonal_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == diagonal_covariance) {
    return false;
  }

  if (diagonal_covariance->size() != static_cast<std::size_t>(num_order_ + 1)) {
    diagonal_covariance->resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);
  double* variance(&((*diagonal_covariance)[0]));

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i];
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i] - mu[i] * mu[i];
    }
  }

  return true;
}